

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_debug_note_teardown_(event *ev)

{
  undefined1 local_30 [8];
  event_debug_entry find;
  event_debug_entry *dent;
  event *ev_local;
  
  if (event_debug_mode_on_ != 0) {
    find.node.hte_next = (event_debug_entry *)ev;
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
    }
    find._16_8_ = event_debug_map_HT_REMOVE(&global_debug_map,(event_debug_entry *)local_30);
    if ((event_debug_entry *)find._16_8_ != (event_debug_entry *)0x0) {
      event_mm_free_((void *)find._16_8_);
    }
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
    }
  }
  event_debug_mode_too_late = 1;
  return;
}

Assistant:

static void event_debug_note_teardown_(const struct event *ev)
{
	struct event_debug_entry *dent, find;

	if (!event_debug_mode_on_)
		goto out;

	find.ptr = ev;
	EVLOCK_LOCK(event_debug_map_lock_, 0);
	dent = HT_REMOVE(event_debug_map, &global_debug_map, &find);
	if (dent)
		mm_free(dent);
	EVLOCK_UNLOCK(event_debug_map_lock_, 0);

out:
	event_debug_mode_too_late = 1;
}